

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O1

void __thiscall jbcoin::STAmount::STAmount(STAmount *this,SerialIter *sit,SField *name)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  base_uint<160UL,_void> local_5c;
  uint32_t local_48 [5];
  base_uint<160UL,_void> local_34;
  
  (this->super_STBase).fName = name;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
  (this->mIssue).currency.pn[0] = 0;
  (this->mIssue).currency.pn[1] = 0;
  (this->mIssue).currency.pn[2] = 0;
  (this->mIssue).currency.pn[3] = 0;
  *(undefined8 *)((this->mIssue).currency.pn + 4) = 0;
  (this->mIssue).account.pn[1] = 0;
  (this->mIssue).account.pn[2] = 0;
  (this->mIssue).account.pn[3] = 0;
  (this->mIssue).account.pn[4] = 0;
  uVar5 = SerialIter::get64(sit);
  if ((long)uVar5 < 0) {
    SerialIter::getBitString<160,void>(&local_5c,sit);
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = 0;
    if (local_5c.pn[0] == 0) {
      uVar7 = 0xffffffffffffffff;
      do {
        if (uVar7 == 3) {
          uVar6 = 4;
          break;
        }
        uVar6 = uVar7 + 1;
        lVar3 = uVar7 + 2;
        uVar7 = uVar6;
      } while (local_5c.pn[lVar3] == 0);
      if (3 < uVar6) {
        Throw<std::runtime_error,char_const(&)[24]>((char (*) [24])"invalid native currency");
      }
    }
    SerialIter::getBitString<160,void>(&local_34,sit);
    local_48[4] = local_34.pn[4];
    local_48[0] = local_34.pn[0];
    local_48[1] = local_34.pn[1];
    uVar4 = local_48._0_8_;
    local_48[2] = local_34.pn[2];
    local_48[3] = local_34.pn[3];
    local_48[0] = local_34.pn[0];
    local_48._0_8_ = uVar4;
    if (local_48[0] == 0) {
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        if (uVar6 == 4) {
          uVar6 = 4;
          break;
        }
        uVar7 = uVar6 + 1;
      } while (local_48[uVar6 + 1] == 0);
      if (3 < uVar6) {
        Throw<std::runtime_error,char_const(&)[23]>((char (*) [23])"invalid native account");
      }
    }
    uVar7 = uVar5 & 0x3fffffffffffff;
    uVar2 = (uint)(uVar5 >> 0x20);
    if (uVar7 == 0) {
      if (uVar2 >> 0x16 != 0x200) goto LAB_001b00be;
      uVar7 = 0;
      iVar8 = 0;
      bVar9 = false;
    }
    else {
      if ((uVar7 + 0xffdc790d903f0000 < 0xffe0068c35058000) ||
         (uVar1 = uVar2 >> 0x16 & 0xff, uVar1 - 0xb2 < 0xffffff4f)) {
LAB_001b00be:
        Throw<std::runtime_error,char_const(&)[23]>((char (*) [23])"invalid currency value");
      }
      iVar8 = uVar1 - 0x61;
      bVar9 = (uVar2 >> 0x1e & 1) == 0;
    }
    (this->mIssue).currency.pn[4] = local_5c.pn[4];
    *(ulong *)(this->mIssue).currency.pn = CONCAT44(local_5c.pn[1],local_5c.pn[0]);
    *(undefined8 *)((this->mIssue).currency.pn + 2) = local_5c.pn._8_8_;
    (this->mIssue).account.pn[4] = local_34.pn[4];
    *(undefined8 *)(this->mIssue).account.pn = local_34.pn._0_8_;
    *(undefined8 *)((this->mIssue).account.pn + 2) = local_34.pn._8_8_;
    this->mValue = uVar7;
    this->mOffset = iVar8;
    this->mIsNegative = bVar9;
    canonicalize(this);
  }
  else if (uVar5 < 0x4000000000000000) {
    if (uVar5 == 0) {
      Throw<std::runtime_error,char_const(&)[31]>((char (*) [31])"negative zero is not canonical");
    }
    this->mValue = uVar5;
    this->mOffset = 0;
    this->mIsNative = true;
    this->mIsNegative = true;
  }
  else {
    this->mValue = uVar5 & 0x3fffffffffffffff;
    this->mOffset = 0;
    this->mIsNative = true;
    this->mIsNegative = false;
  }
  return;
}

Assistant:

STAmount::STAmount(SerialIter& sit, SField const& name)
    : STBase(name)
{
    std::uint64_t value = sit.get64 ();

    // native
    if ((value & cNotNative) == 0)
    {
        // positive
        if ((value & cPosNative) != 0)
        {
            mValue = value & ~cPosNative;
            mOffset = 0;
            mIsNative = true;
            mIsNegative = false;
            return;
        }

        // negative
        if (value == 0)
            Throw<std::runtime_error> ("negative zero is not canonical");

        mValue = value;
        mOffset = 0;
        mIsNative = true;
        mIsNegative = true;
        return;
    }

    Issue issue;
    issue.currency.copyFrom (sit.get160 ());

    if (isXRP (issue.currency))
        Throw<std::runtime_error> ("invalid native currency");

    issue.account.copyFrom (sit.get160 ());

    if (isXRP (issue.account))
        Throw<std::runtime_error> ("invalid native account");

    // 10 bits for the offset, sign and "not native" flag
    int offset = static_cast<int>(value >> (64 - 10));

    value &= ~ (1023ull << (64 - 10));

    if (value)
    {
        bool isNegative = (offset & 256) == 0;
        offset = (offset & 255) - 97; // center the range

        if (value < cMinValue ||
            value > cMaxValue ||
            offset < cMinOffset ||
            offset > cMaxOffset)
        {
            Throw<std::runtime_error> ("invalid currency value");
        }

        mIssue = issue;
        mValue = value;
        mOffset = offset;
        mIsNegative = isNegative;
        canonicalize();
        return;
    }

    if (offset != 512)
        Throw<std::runtime_error> ("invalid currency value");

    mIssue = issue;
    mValue = 0;
    mOffset = 0;
    mIsNegative = false;
    canonicalize();
}